

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O3

void __thiscall Tree::BuildUnit(Tree *this,string *unitString,string *fsPath)

{
  long *plVar1;
  long *plVar2;
  size_type *psVar3;
  pointer pbVar4;
  pointer this_00;
  char *__end;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar4 = (this->files).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar4 != (this->files).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::operator+(&local_50,"      <Unit filename=\"",fsPath);
      plVar1 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_50,(ulong)(pbVar4->_M_dataplus)._M_p);
      local_70 = &local_60;
      plVar2 = plVar1 + 2;
      if ((long *)*plVar1 == plVar2) {
        local_60 = *plVar2;
        lStack_58 = plVar1[3];
      }
      else {
        local_60 = *plVar2;
        local_70 = (long *)*plVar1;
      }
      local_68 = plVar1[1];
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
      psVar3 = (size_type *)(plVar1 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar1 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_90.field_2._M_allocated_capacity = *psVar3;
        local_90.field_2._8_8_ = plVar1[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar3;
        local_90._M_dataplus._M_p = (pointer)*plVar1;
      }
      local_90._M_string_length = plVar1[1];
      *plVar1 = (long)psVar3;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__cxx11::string::_M_append((char *)unitString,(ulong)local_90._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)unitString);
      std::__cxx11::string::append((char *)unitString);
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != (this->files).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  this_00 = (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (this_00 !=
      (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"","");
      BuildUnitImpl(this_00,unitString,&local_90,fsPath);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      this_00 = this_00 + 1;
    } while (this_00 !=
             (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void Tree::BuildUnit(std::string& unitString, const std::string& fsPath) const
{
  for (std::vector<std::string>::const_iterator it = files.begin();
       it != files.end();
       ++it)
    {
    unitString += "      <Unit filename=\"" + fsPath + *it + "\">\n";
    unitString += "          <Option virtualFolder=\"CMake Files\\\" />\n";
    unitString += "      </Unit>\n";
    }
  for (std::vector<Tree>::const_iterator it = folders.begin();
     it != folders.end();
     ++it)
    {
    it->BuildUnitImpl(unitString, "", fsPath);
    }
}